

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_header.cpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::debug_line_index::debug_line_index
          (debug_line_index *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction)

{
  transaction_base *this_00;
  database *db;
  debug_line_index *this_local;
  not_null<transaction_base_*> transaction_local;
  not_null<context_*> ctxt_local;
  
  this_local = (debug_line_index *)transaction.ptr_;
  transaction_local.ptr_ = (transaction_base *)ctxt.ptr_;
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__debug_line_index_00238e20;
  this_00 = gsl::not_null<pstore::transaction_base_*>::operator->
                      ((not_null<pstore::transaction_base_*> *)&this_local);
  db = transaction_base::db(this_00);
  pstore::index::
  get_index<(pstore::trailer::indices)1,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&this->index_,db,true);
  uint128::uint128(&this->digest_);
  (this->transaction_).ptr_ = (transaction_base *)this_local;
  return;
}

Assistant:

debug_line_index::debug_line_index (not_null<context *> const ctxt,
                                                not_null<transaction_base *> const transaction)
                    : rule (ctxt)
                    , index_{index::get_index<trailer::indices::debug_line_header> (
                          transaction->db ())}
                    , transaction_{transaction} {}